

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_hoa.cpp
# Opt level: O3

void __thiscall
ear::GainCalculatorHOAImpl::calculate
          (GainCalculatorHOAImpl *this,HOATypeMetadata *metadata,OutputGainMat *direct,
          WarningCB *warning_cb)

{
  double dVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  norm_f_t *norm_from;
  uint uVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Index outerSize;
  const_iterator cVar9;
  invalid_argument *piVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_type *psVar13;
  char *pcVar14;
  Index inner;
  long lVar15;
  size_type *psVar16;
  norm_f_t *in_R9;
  long lVar17;
  double *pdVar18;
  Index col;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pPVar19;
  ulong uVar20;
  Index row;
  long lVar21;
  undefined1 auVar22 [16];
  MatrixXd D;
  MatrixXd D_full;
  MatrixXd Y_virt;
  MatrixXd D_virt;
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> m;
  Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> n;
  undefined1 local_1c8 [8];
  _Alloc_hider local_1c0;
  undefined1 local_1b8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b0;
  variable_if_dynamic<long,__1> local_1a0;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *local_198;
  MatrixXd local_190;
  DenseStorage<double,__1,__1,__1,_0> local_178;
  OutputGainMat *local_160;
  VectorXi local_158;
  VectorXi local_148;
  VectorXi local_138;
  Matrix<double,__1,_3,_0,__1,_3> local_128;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_100;
  DenseStorage<double,__1,__1,_3,_0> local_c8;
  DenseStorage<double,__1,__1,__1,_0> local_b8;
  DenseStorage<double,__1,__1,__1,_0> local_a0;
  void *local_88;
  long local_80;
  pointer local_70;
  long local_68;
  pointer local_58;
  long local_50;
  CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
  local_40;
  
  piVar3 = (metadata->orders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (metadata->orders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  psVar13 = (size_type *)((long)piVar4 - (long)piVar3);
  piVar5 = (metadata->degrees).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar13 !=
      (size_type *)
      ((long)(metadata->degrees).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)piVar5)) {
    piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_1c8 = (undefined1  [8])local_1b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c8,"orders and degrees must be the same size","");
    std::invalid_argument::invalid_argument(piVar10,(string *)local_1c8);
    *(undefined ***)piVar10 = &PTR__invalid_argument_00199f30;
    __cxa_throw(piVar10,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (piVar4 != piVar3) {
    psVar13 = (size_type *)(((long)psVar13 >> 2) + (ulong)((long)psVar13 >> 2 == 0));
    psVar16 = (size_type *)0x0;
    do {
      if (piVar3[(long)psVar16] < 0) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_1c8 = (undefined1  [8])local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"orders must not be negative","");
        std::invalid_argument::invalid_argument(piVar10,(string *)local_1c8);
        *(undefined ***)piVar10 = &PTR__invalid_argument_00199f30;
        __cxa_throw(piVar10,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      uVar2 = piVar5[(long)psVar16];
      uVar6 = -uVar2;
      if (0 < (int)uVar2) {
        uVar6 = uVar2;
      }
      in_R9 = (norm_f_t *)(ulong)uVar6;
      if ((uint)piVar3[(long)psVar16] < uVar6) {
        piVar10 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_1c8 = (undefined1  [8])local_1b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"magnitude of degree must not be greater than order","");
        std::invalid_argument::invalid_argument(piVar10,(string *)local_1c8);
        *(undefined ***)piVar10 = &PTR__invalid_argument_00199f30;
        __cxa_throw(piVar10,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      psVar16 = (size_type *)((long)psVar16 + 1);
    } while (psVar13 != psVar16);
  }
  local_160 = direct;
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double_(&)(int,_int)>_>_>
                  *)ADM_norm_types_abi_cxx11_,&metadata->normalization);
  if (cVar9._M_node == (_Base_ptr)(ADM_norm_types_abi_cxx11_ + 8)) {
    this = (GainCalculatorHOAImpl *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                   "unknown normalization type: \'",&metadata->normalization);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_100);
    auVar8._8_8_ = local_1b8;
    auVar8._0_8_ = plVar11;
    auVar22._8_8_ = (size_type *)*plVar11;
    auVar22._0_8_ = plVar11;
    psVar13 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar13) {
      local_1b8 = (undefined1  [8])*psVar13;
      aStack_1b0._M_allocated_capacity = plVar11[3];
      goto LAB_00127085;
    }
  }
  else {
    pPVar19 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)(local_1b8 + 8);
    if (metadata->screenRef != true) {
LAB_00126949:
      if ((metadata->nfcRefDist != 0.0) || (NAN(metadata->nfcRefDist))) {
        local_1c8._0_4_ = 5;
        local_1c0._M_p = (pointer)pPVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c0,"nfcRefDist is not implemented; ignoring","");
        if ((warning_cb->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
          goto LAB_00127074;
        }
        (*warning_cb->_M_invoker)((_Any_data *)warning_cb,(Warning *)local_1c8);
        if ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1c0._M_p != pPVar19) {
          operator_delete(local_1c0._M_p,(ulong)(aStack_1b0._0_8_ + 1));
        }
      }
      norm_from = *(norm_f_t **)(cVar9._M_node + 2);
      local_58 = (metadata->orders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_50 = (long)(metadata->orders).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)local_58 >> 2;
      if (-1 < local_50) {
        local_70 = (metadata->degrees).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_68 = (long)(metadata->degrees).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)local_70 >> 2;
        if (-1 < local_68) {
          Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
                    (&local_c8,(DenseStorage<double,__1,__1,_3,_0> *)this);
          Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                    ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_128,
                     (DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)&local_58);
          Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
          PlainObjectBase<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                    ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_138,
                     (DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                      *)&local_70);
          hoa::calc_Y_virt<double(*)(int,int)>
                    ((MatrixXd *)&local_118,(hoa *)&local_c8,&local_128,&local_138,
                     (VectorXi *)hoa::norm_N3D,in_R9);
          free(local_138.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          free(local_128.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
               m_data);
          free(local_c8.m_data);
          if ((local_118.m_rows | local_118.m_cols) < 0) {
            pcVar14 = 
            "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1, -1, -1>]"
            ;
LAB_00127065:
            __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                          ,0x4a,pcVar14);
          }
          aStack_1b0._M_allocated_capacity =
               (size_type)
               (double)(this->points).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>
                       .m_storage.m_rows;
          local_1c0._M_p = (pointer)local_118.m_cols;
          local_1b8 = (undefined1  [8])local_118.m_rows;
          local_1c8 = (undefined1  [8])&local_118;
          Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
          PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const>>
                    ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_88,
                     (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>_>
                      *)local_1c8);
          if ((this->G_virt).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols == local_80) {
            local_1c8 = (undefined1  [8])&this->G_virt;
            local_1c0._M_p = (pointer)&local_88;
            Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
            PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
                      ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_190,
                       (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                        *)local_1c8);
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_a0,&local_118);
            hoa::normalize_decode_matrix(&local_190,(MatrixXd *)&local_a0);
            free(local_a0.m_data);
            Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                      ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_148,
                       (DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)&local_58);
            Eigen::PlainObjectBase<Eigen::Matrix<int,-1,1,0,-1,1>>::
            PlainObjectBase<Eigen::Map<Eigen::Matrix<int,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
                      ((PlainObjectBase<Eigen::Matrix<int,_1,1,0,_1,1>> *)&local_158,
                       (DenseBase<Eigen::Map<const_Eigen::Matrix<int,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                        *)&local_70);
            hoa::normalisation_conversion<double(*)(int,int),double(*)(int,int)>
                      ((hoa *)local_1c8,&local_148,&local_158,hoa::norm_N3D,norm_from);
            if ((pointer)local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols == local_1c0._M_p) {
              if (0 < local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols) {
                lVar17 = 0;
                pPVar19 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)0x0;
                pdVar18 = local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_data;
                do {
                  if (0 < lVar17) {
                    local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data
                    [(long)pPVar19 *
                     local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows] =
                         local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_data
                         [(long)pPVar19 *
                          local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_rows] * *(double *)((long)local_1c8 + (long)pPVar19 * 8);
                  }
                  uVar20 = local_190.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows - lVar17 & 0xfffffffffffffffe;
                  lVar15 = uVar20 + lVar17;
                  lVar21 = lVar17;
                  if (0 < (long)uVar20) {
                    do {
                      dVar7 = (pdVar18 + lVar21)[1];
                      dVar1 = *(double *)((long)local_1c8 + (long)pPVar19 * 8);
                      pdVar18[lVar21] = dVar1 * pdVar18[lVar21];
                      (pdVar18 + lVar21)[1] = dVar1 * dVar7;
                      lVar21 = lVar21 + 2;
                    } while (lVar21 < lVar15);
                  }
                  for (; lVar15 < local_190.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_rows; lVar15 = lVar15 + 1) {
                    pdVar18[lVar15] =
                         pdVar18[lVar15] * *(double *)((long)local_1c8 + (long)pPVar19 * 8);
                  }
                  lVar17 = (long)(lVar17 + (ulong)((uint)local_190.
                                                                                                                  
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                                  .m_storage.m_rows & 1)) % 2;
                  if (local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_rows < lVar17) {
                    lVar17 = local_190.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows;
                  }
                  pPVar19 = pPVar19 + 1;
                  pdVar18 = pdVar18 + local_190.
                                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                      .m_storage.m_rows;
                } while (pPVar19 !=
                         (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                         local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols);
              }
              free((void *)local_1c8);
              free(local_158.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              free(local_148.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              local_1c8 = (undefined1  [8])
                          (this->is_lfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>
                          .m_storage.m_rows;
              local_1c0._M_p =
                   (pointer)local_190.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
              local_1b8 = (undefined1  [8])0x0;
              if (-1 < (long)(local_190.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols | (ulong)local_1c8)) {
                Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
                PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                          ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_178,
                           (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                            *)local_1c8);
                if (0 < local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols) {
                  lVar17 = 0;
                  do {
                    local_1c8 = (undefined1  [8])(local_178.m_data + local_178.m_rows * lVar17);
                    local_1c0._M_p = (pointer)local_178.m_rows;
                    if (local_178.m_rows < 0 && local_178.m_data != (double *)0x0) {
LAB_00126e15:
                      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                                    ,0xb2,
                                    "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                                   );
                    }
                    aStack_1b0._8_8_ = 0;
                    local_198 = (PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                                local_178.m_rows;
                    aStack_1b0._M_allocated_capacity = (size_type)&local_178;
                    local_1a0.m_value = lVar17;
                    if (local_178.m_cols <= lVar17) {
                      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                                    ,0x7a,
                                    "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                                   );
                    }
                    local_100.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                    .m_data = local_190.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data +
                              local_190.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows * lVar17;
                    local_100.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_1>
                    .
                    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                    .m_rows.m_value =
                         local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_rows;
                    local_40.m_xpr = &this->is_lfe;
                    if (local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows < 0 &&
                        local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data != (double *)0x0) goto LAB_00126e15;
                    local_100.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .m_xpr = &local_190;
                    local_100.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .m_startRow.m_value = 0;
                    local_100.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .m_outerStride =
                         local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_rows;
                    local_100.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>
                    .m_startCol.m_value = lVar17;
                    mask_write<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                               local_1c8,&local_40,&local_100);
                    lVar17 = lVar17 + 1;
                  } while (lVar17 < local_190.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols);
                }
                Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_b8,&local_178);
                OutputGainMat::write_mat<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                          (local_160,(Matrix<double,__1,__1,_0,__1,__1> *)&local_b8);
                free(local_b8.m_data);
                free(local_178.m_data);
                free(local_190.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data);
                free(local_88);
                free(local_118.m_data);
                return;
              }
              pcVar14 = 
              "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
              ;
              goto LAB_00127065;
            }
            pcVar14 = 
            "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Option = 1]"
            ;
          }
          else {
            pcVar14 = 
            "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
            ;
          }
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Product.h"
                        ,0x62,pcVar14);
        }
      }
      __assert_fail("vecSize >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                    ,0xa6,
                    "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<int, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<int, -1, 1>>, Level = 0]"
                   );
    }
    local_1c8._0_4_ = 4;
    local_1c0._M_p = (pointer)pPVar19;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1c0,"screenRef for HOA is not implemented; ignoring","");
    if ((warning_cb->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*warning_cb->_M_invoker)((_Any_data *)warning_cb,(Warning *)local_1c8);
      if ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_1c0._M_p != pPVar19) {
        operator_delete(local_1c0._M_p,(ulong)(aStack_1b0._0_8_ + 1));
      }
      goto LAB_00126949;
    }
LAB_00127074:
    auVar22 = std::__throw_bad_function_call();
  }
  local_1b8 = (undefined1  [8])*psVar13;
  auVar8 = auVar22;
LAB_00127085:
  local_1c8 = auVar8._8_8_;
  puVar12 = auVar8._0_8_;
  local_1c0._M_p = (pointer)puVar12[1];
  *puVar12 = psVar13;
  puVar12[1] = 0;
  *(undefined1 *)(puVar12 + 2) = 0;
  adm_error::adm_error((adm_error *)this,(string *)local_1c8);
  __cxa_throw(this,&adm_error::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GainCalculatorHOAImpl::calculate(const HOATypeMetadata &metadata,
                                        OutputGainMat &direct,
                                        const WarningCB &warning_cb) {
    if (metadata.orders.size() != metadata.degrees.size())
      throw invalid_argument("orders and degrees must be the same size");

    for (size_t i = 0; i < metadata.orders.size(); i++) {
      if (metadata.orders[i] < 0)
        throw invalid_argument("orders must not be negative");
      if (std::abs(metadata.degrees[i]) > metadata.orders[i])
        throw invalid_argument(
            "magnitude of degree must not be greater than order");
    }

    auto norm_it = ADM_norm_types.find(metadata.normalization);
    if (norm_it == ADM_norm_types.end())
      throw adm_error("unknown normalization type: '" + metadata.normalization +
                      "'");

    if (metadata.screenRef)
      warning_cb({Warning::Code::HOA_SCREENREF_NOT_IMPLEMENTED,
                  "screenRef for HOA is not implemented; ignoring"});

    if (metadata.nfcRefDist != 0.0)
      warning_cb({Warning::Code::HOA_NFCREFDIST_NOT_IMPLEMENTED,
                  "nfcRefDist is not implemented; ignoring"});

    hoa::norm_f_t &norm = norm_it->second;

    Eigen::Map<const Eigen::VectorXi> n(metadata.orders.data(),
                                        metadata.orders.size());
    Eigen::Map<const Eigen::VectorXi> m(metadata.degrees.data(),
                                        metadata.degrees.size());

    Eigen::MatrixXd Y_virt = hoa::calc_Y_virt(points, n, m, hoa::norm_N3D);
    Eigen::MatrixXd D_virt = Y_virt.transpose() / points.rows();

    Eigen::MatrixXd D = G_virt * D_virt;

    hoa::normalize_decode_matrix(D, Y_virt);

    D *= hoa::normalisation_conversion(n, m, hoa::norm_N3D, norm).asDiagonal();

    Eigen::MatrixXd D_full = Eigen::MatrixXd::Zero(is_lfe.size(), D.cols());
    for (Eigen::Index in_i = 0; in_i < D.cols(); in_i++) {
      mask_write(D_full.col(in_i), !is_lfe, D.col(in_i));
    }

    direct.write_mat(D_full);
  }